

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.h
# Opt level: O3

bool __thiscall
wallet::DatabaseBatch::Write<std::pair<std::__cxx11::string,CScript>,unsigned_char>
          (DatabaseBatch *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>
          *key,uchar *value,bool fOverwrite)

{
  int iVar1;
  long in_FS_OFFSET;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_78;
  undefined8 uStack_60;
  DataStream local_58;
  uchar local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_read_pos = 0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve(&local_58.vch,1000);
  Serialize<DataStream,char>(&local_58,&key->first);
  SerializeMany<DataStream,prevector<28u,unsigned_char,unsigned_int,int>>
            (&local_58,&(key->second).super_CScriptBase);
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_60 = 0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_78,10000);
  local_29 = *value;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_78,
             local_78._M_impl.super__Vector_impl_data._M_finish,&local_29);
  iVar1 = (*this->_vptr_DatabaseBatch[1])(this,&local_58,&local_78,(ulong)fOverwrite);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_78);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SUB41(iVar1,0);
  }
  __stack_chk_fail();
}

Assistant:

bool Write(const K& key, const T& value, bool fOverwrite = true)
    {
        DataStream ssKey{};
        ssKey.reserve(1000);
        ssKey << key;

        DataStream ssValue{};
        ssValue.reserve(10000);
        ssValue << value;

        return WriteKey(std::move(ssKey), std::move(ssValue), fOverwrite);
    }